

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Iterator<float,_true,_std::allocator<unsigned_long>_>::Iterator
          (Iterator<float,_true,_std::allocator<unsigned_long>_> *this,
          View<float,_false,_std::allocator<unsigned_long>_> *view,size_t index)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  View<float,_true,_std::allocator<unsigned_long>_> *this_01;
  long lVar1;
  reference pfVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  runtime_error *prVar6;
  ulong uVar7;
  allocator_type local_2d;
  int local_2c;
  
  this->view_ = (view_pointer)view;
  this->pointer_ = (pointer)0x0;
  this->index_ = index;
  if (view->data_ == (pointer)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = &this->coordinates_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(view->geometry_).dimension_,&local_2d);
  if ((view->geometry_).size_ == 0) {
    if (index != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Assertion failed.");
LAB_00123ed9:
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(view);
    uVar7 = (view->geometry_).size_;
    if ((view->geometry_).isSimple_ == true) {
      if (uVar7 < index) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        goto LAB_00123ed9;
      }
      local_2c = 0;
      pfVar2 = marray_detail::AccessOperatorHelper<true>::
               execute<float,int,false,std::allocator<unsigned_long>>(view,&local_2c);
      pfVar2 = pfVar2 + index;
    }
    else if (index < uVar7) {
      View<float,false,std::allocator<unsigned_long>>::
      indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<float,false,std::allocator<unsigned_long>> *)view,index,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start);
      pfVar2 = View<float,_false,_std::allocator<unsigned_long>_>::operator()(view,index);
    }
    else {
      this_01 = this->view_;
      View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(this_01);
      if (*(int *)(this_01 + 0x38) == 1) {
        sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::shape(view,0);
        *(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start = sVar3;
        if (view->data_ != (pointer)0x0) {
          uVar7 = 1;
          do {
            if ((view->geometry_).dimension_ <= uVar7) goto LAB_00123e5e;
            sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::shape(view,uVar7);
            (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar7] = sVar3 - 1;
            uVar7 = uVar7 + 1;
          } while (view->data_ != (pointer)0x0);
        }
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*(long *)this->view_ == 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar1 = *(long *)(this->view_ + 0x28);
      sVar3 = lVar1 - 1;
      sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(view,sVar3);
      (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar1 + -1] = sVar4;
      if (sVar3 != 0) {
        sVar4 = 0;
        do {
          sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::shape(view,sVar4);
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar4] = sVar5 - 1;
          sVar4 = sVar4 + 1;
        } while (sVar3 != sVar4);
      }
LAB_00123e5e:
      pfVar2 = View<float,_false,_std::allocator<unsigned_long>_>::operator()
                         (view,(view->geometry_).size_ - 1);
      pfVar2 = pfVar2 + 1;
    }
    this->pointer_ = pfVar2;
  }
  testInvariant(this);
  return;
}

Assistant:

inline Iterator<T, isConst, A>::Iterator
(
    const View<T, false, A>& view,
    const std::size_t index
)
:   view_(reinterpret_cast<view_pointer>(&view)),
    pointer_(0),
    index_(index),
    coordinates_(std::vector<std::size_t>(view.dimension()))
    // Note for developers: If isConst==true, the construction
    // view_(reinterpret_cast<view_pointer>(&view)) works as well.
    // This is intended because it should be possible to construct 
    // a constant iterator on mutable data.
{
    if(view.size() == 0) { // un-initialized view
        marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
    }
    else {
        if(view.isSimple()) {
            marray_detail::Assert(MARRAY_NO_ARG_TEST || index <= view.size());
            pointer_ = &view(0) + index;
        }
        else {
            if(index >= view.size()) { // end iterator
                if(view_->coordinateOrder() == LastMajorOrder) {
                    coordinates_[0] = view.shape(0);
                    for(std::size_t j=1; j<view.dimension(); ++j) {
                        coordinates_[j] = view.shape(j)-1;
                    }
                }
                else { // FirstMajorOrder
                    std::size_t d = view_->dimension() - 1;
                    coordinates_[d] = view.shape(d);
                    for(std::size_t j=0; j<d; ++j) {
                        coordinates_[j] = view.shape(j)-1;
                    }
                }
                pointer_ = &view(view.size()-1) + 1;
            }
            else {
                view.indexToCoordinates(index, coordinates_.begin());
                pointer_ = &view(index);
            }
        }
    }
    testInvariant();
}